

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsItemFocused(void)

{
  ImGuiID IVar1;
  
  IVar1 = (GImGui->LastItemData).ID;
  if ((GImGui->NavId != 0 && GImGui->NavId == IVar1) &&
     ((IVar1 != GImGui->CurrentWindow->ID || (GImGui->CurrentWindow->WriteAccessed == false)))) {
    return true;
  }
  return false;
}

Assistant:

bool ImGui::IsItemFocused()
{
    ImGuiContext& g = *GImGui;
    if (g.NavId != g.LastItemData.ID || g.NavId == 0)
        return false;

    // Special handling for the dummy item after Begin() which represent the title bar or tab.
    // When the window is collapsed (SkipItems==true) that last item will never be overwritten so we need to detect the case.
    ImGuiWindow* window = g.CurrentWindow;
    if (g.LastItemData.ID == window->ID && window->WriteAccessed)
        return false;

    return true;
}